

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int compression_init_encoder_xz(archive *a,la_zstream_conflict *lastrm,int level,int threads)

{
  char cVar1;
  void *__dest;
  undefined1 local_130 [4];
  int local_12c;
  lzma_mt mt_options;
  undefined1 local_a8 [4];
  int r;
  lzma_options_lzma lzma_opt;
  lzma_filter *lzmafilters;
  lzma_stream *strm;
  int threads_local;
  int level_local;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  __dest = calloc(1,0xa8);
  if (__dest == (void *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for xz stream");
    a_local._4_4_ = -0x1e;
  }
  else {
    lzma_opt.reserved_ptr2 = (void *)((long)__dest + 0x88);
    strm._4_4_ = level;
    if (9 < level) {
      strm._4_4_ = 9;
    }
    cVar1 = lzma_lzma_preset(local_a8,strm._4_4_);
    if (cVar1 == '\0') {
      *(undefined8 *)lzma_opt.reserved_ptr2 = 0x21;
      *(undefined1 **)((long)lzma_opt.reserved_ptr2 + 8) = local_a8;
      *(undefined8 *)((long)lzma_opt.reserved_ptr2 + 0x10) = 0xffffffffffffffff;
      memcpy(__dest,&compression_init_encoder_xz::lzma_init_data,0x88);
      if (threads < 2) {
        mt_options.reserved_ptr4._4_4_ = lzma_stream_encoder(__dest,lzma_opt.reserved_ptr2,4);
      }
      else {
        memset(local_130,0,0x80);
        mt_options.block_size._0_4_ = 300;
        mt_options._16_8_ = lzma_opt.reserved_ptr2;
        mt_options.filters._0_4_ = 4;
        local_12c = threads;
        mt_options.reserved_ptr4._4_4_ = lzma_stream_encoder_mt(__dest,local_130);
      }
      if (mt_options.reserved_ptr4._4_4_ == 0) {
        lastrm->real_stream = __dest;
        lastrm->valid = 1;
        lastrm->code = compression_code_lzma;
        lastrm->end = compression_end_lzma;
        mt_options.reserved_ptr4._4_4_ = 0;
      }
      else if (mt_options.reserved_ptr4._4_4_ == 5) {
        free(__dest);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,0xc,
                          "Internal error initializing compression library: Cannot allocate memory")
        ;
        mt_options.reserved_ptr4._4_4_ = -0x1e;
      }
      else {
        free(__dest);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,-1,
                          "Internal error initializing compression library: It\'s a bug in liblzma")
        ;
        mt_options.reserved_ptr4._4_4_ = -0x1e;
      }
      a_local._4_4_ = mt_options.reserved_ptr4._4_4_;
    }
    else {
      free(__dest);
      lastrm->real_stream = (void *)0x0;
      archive_set_error(a,0xc,"Internal error initializing compression library");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_xz(struct archive *a,
    struct la_zstream *lastrm, int level, int threads)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
	lzma_mt mt_options;
#endif

	(void)threads; /* UNUSED (if multi-threaded LZMA library not avail) */

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for xz stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 9)
		level = 9;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = LZMA_FILTER_LZMA2;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	*strm = lzma_init_data;
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
	if (threads > 1) {
		memset(&mt_options, 0, sizeof(mt_options));
		mt_options.threads = threads;
		mt_options.timeout = 300;
		mt_options.filters = lzmafilters;
		mt_options.check = LZMA_CHECK_CRC64;
		r = lzma_stream_encoder_mt(strm, &mt_options);
	} else
#endif
		r = lzma_stream_encoder(strm, lzmafilters, LZMA_CHECK_CRC64);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}